

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::WasmByteCodeWriter::AsmBr(WasmByteCodeWriter *this,ByteCodeLabel labelID,OpCodeAsmJs op)

{
  ByteCodeWriter *this_00;
  Data *this_01;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined1 local_34 [8];
  OpLayoutAsmBr data;
  
  this_00 = &this->super_ByteCodeWriter;
  ByteCodeWriter::CheckOpen(this_00);
  ByteCodeWriter::CheckLabel(this_00,labelID);
  bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/AsmJsByteCodeWriter.cpp"
                                ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_01 = &(this->super_ByteCodeWriter).m_byteCodeData;
  ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_01,op,this_00);
  if ((ushort)(op - StartCall) < 0xfff8) {
    puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
    *puVar1 = *puVar1 + 1;
  }
  ByteCodeWriter::IncreaseByteCodeCount(this_00);
  ByteCodeWriter::Data::Write(this_01,local_34,4);
  AddJumpOffset(this,EndOfBlock,labelID,4);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmBr(ByteCodeLabel labelID, OpCodeAsmJs op)
    {
        CheckOpen();
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutAsmBr) - offsetof(OpLayoutAsmBr, RelativeJumpOffset);
        OpLayoutAsmBr data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }